

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  time_t tVar8;
  int in_EDI;
  char data [256];
  time_t time_now;
  time_t last_time;
  fnode_service_t *service;
  uint32_t in_stack_00000284;
  char *in_stack_00000288;
  fnode_service_t *in_stack_00000290;
  int in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  char local_148 [264];
  time_t local_40;
  time_t local_38;
  fnode_service_t *local_30;
  int local_20;
  undefined4 local_1c;
  
  local_1c = 0;
  local_20 = in_EDI;
  tVar8 = time((time_t *)0x0);
  srand((uint)tVar8);
  if (local_20 < 2) {
    fprintf(_stderr,"Usage: test-cocl SERIAL-NUMBER\n");
  }
  else {
    local_30 = fnode_service_create
                         ((char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                          (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    if (local_30 != (fnode_service_t *)0x0) {
      fnode_service_reg_handler(local_30,handler);
      local_38 = 0;
      do {
        do {
          fnode_service_update
                    ((fnode_service_t *)
                     CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
          local_40 = time((time_t *)0x0);
        } while (local_40 - local_38 < 0xb);
        iVar1 = rand();
        iVar2 = rand();
        iVar3 = rand();
        in_stack_fffffffffffffe60 = rand();
        in_stack_fffffffffffffe60 = in_stack_fffffffffffffe60 % 2;
        iVar4 = rand();
        iVar5 = rand();
        iVar6 = rand();
        iVar7 = rand();
        snprintf(local_148,0x100,"%d%d%d%d%d%d%d%d%d",0,(ulong)(uint)(iVar1 % 2),
                 (ulong)(uint)(iVar2 % 2),iVar3 % 2,in_stack_fffffffffffffe60,iVar4 % 2,iVar5 % 2,
                 iVar6 % 2,iVar7 % 2);
        strlen(local_148);
        fnode_service_notify_state(in_stack_00000290,in_stack_00000288,in_stack_00000284);
        local_38 = local_40;
      } while( true );
    }
    fprintf(_stderr,"Failed to create COCL service\n");
  }
  return -1;
}

Assistant:

int main(int argc, char ** argv)
{
    srand(time(0));

    if (argc < 2)
    {
        fprintf(stderr, "Usage: test-cocl SERIAL-NUMBER\n");
        return -1;
    }

    fnode_service_t * service = fnode_service_create(argv[1], "COCL");
    if ( !service )
    {
        fprintf(stderr, "Failed to create COCL service\n");
        return -1;
    }

    fnode_service_reg_handler(service, handler);

    time_t last_time = 0;

    for(;;)
    {
        fnode_service_update(service);

        time_t time_now = time(0);
        if (time_now - last_time > 10)
        {
            char data[256];
            snprintf(data, sizeof data, "%d%d%d%d%d%d%d%d%d",
                    0,
                    rand() % 2, rand() % 2, rand() % 2, rand() % 2, rand() % 2, rand() % 2, rand() % 2, rand() % 2);
            fnode_service_notify_state(service, data, strlen(data));
            last_time = time_now;
        }
    }

    fnode_service_release(service);
    return 0;
}